

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

TestCase * __thiscall
Catch::TestCase::withName(TestCase *__return_storage_ptr__,TestCase *this,string *_newName)

{
  string *_newName_local;
  TestCase *this_local;
  TestCase *other;
  
  TestCase(__return_storage_ptr__,this);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)_newName);
  return __return_storage_ptr__;
}

Assistant:

TestCase TestCase::withName( std::string const& _newName ) const {
        TestCase other( *this );
        other.name = _newName;
        return other;
    }